

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O0

void __thiscall tcu::x11::XcbWindow::~XcbWindow(XcbWindow *this)

{
  XcbWindow *this_local;
  
  ~XcbWindow(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

XcbWindow::~XcbWindow (void)
{
	xcb_flush (m_display.getConnection());
	xcb_free_colormap(m_display.getConnection(), m_colormap);
	xcb_destroy_window(m_display.getConnection(), m_window);
}